

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O3

value_and_holder * __thiscall
pybind11::detail::instance::get_value_and_holder
          (value_and_holder *__return_storage_ptr__,instance *this,type_info *find_type,
          bool throw_if_missing)

{
  void ***__rhs;
  PyTypeObject *type;
  long *plVar1;
  size_type *psVar2;
  anon_union_24_2_63b86169_for_instance_1 *paVar3;
  undefined1 local_130 [8];
  values_and_holders vhs;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (find_type == (type_info *)0x0) {
    __return_storage_ptr__->inst = this;
    __return_storage_ptr__->index = 0;
    __return_storage_ptr__->type = (type_info *)0x0;
  }
  else {
    type = (this->ob_base).ob_type;
    if (type != find_type->type) {
      local_130 = (undefined1  [8])this;
      vhs.inst = (instance *)all_type_info(type);
      values_and_holders::find((iterator *)&vhs.tinfo,(values_and_holders *)local_130,find_type);
      if (CONCAT44(it.curr.inst._4_4_,it.curr.inst._0_4_) ==
          (long)((vhs.inst)->ob_base).ob_type - ((vhs.inst)->ob_base).ob_refcnt >> 3) {
        if (throw_if_missing) {
          __rhs = &it.curr.vh;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__rhs,find_type->type->tp_name,(allocator<char> *)&local_50);
          std::operator+(&local_b0,"pybind11::detail::instance::get_value_and_holder: `",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
          ;
          plVar1 = (long *)std::__cxx11::string::append((char *)&local_b0);
          local_70._M_dataplus._M_p = (pointer)*plVar1;
          psVar2 = (size_type *)(plVar1 + 2);
          if ((size_type *)local_70._M_dataplus._M_p == psVar2) {
            local_70.field_2._M_allocated_capacity = *psVar2;
            local_70.field_2._8_8_ = plVar1[3];
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          }
          else {
            local_70.field_2._M_allocated_capacity = *psVar2;
          }
          local_70._M_string_length = plVar1[1];
          *plVar1 = (long)psVar2;
          plVar1[1] = 0;
          *(undefined1 *)(plVar1 + 2) = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,((this->ob_base).ob_type)->tp_name,
                     (allocator<char> *)&local_50);
          std::operator+(&local_d0,&local_70,&local_90);
          plVar1 = (long *)std::__cxx11::string::append((char *)&local_d0);
          local_50._M_dataplus._M_p = (pointer)*plVar1;
          psVar2 = (size_type *)(plVar1 + 2);
          if ((size_type *)local_50._M_dataplus._M_p == psVar2) {
            local_50.field_2._M_allocated_capacity = *psVar2;
            local_50.field_2._8_8_ = plVar1[3];
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          }
          else {
            local_50.field_2._M_allocated_capacity = *psVar2;
          }
          local_50._M_string_length = plVar1[1];
          *plVar1 = (long)psVar2;
          plVar1[1] = 0;
          *(undefined1 *)(plVar1 + 2) = 0;
          pybind11_fail(&local_50);
        }
        it.types._0_4_ = 0;
        it.types._4_4_ = 0;
        it.curr.inst._0_4_ = 0;
        it.curr.inst._4_4_ = 0;
        __return_storage_ptr__->type = (type_info *)0x0;
        __return_storage_ptr__->vh = (void **)0x0;
      }
      else {
        __return_storage_ptr__->type = (type_info *)it.curr.index;
        __return_storage_ptr__->vh = &(it.curr.type)->type;
      }
      *(undefined4 *)&__return_storage_ptr__->inst = it.types._0_4_;
      *(undefined4 *)((long)&__return_storage_ptr__->inst + 4) = it.types._4_4_;
      *(undefined4 *)&__return_storage_ptr__->index = it.curr.inst._0_4_;
      *(undefined4 *)((long)&__return_storage_ptr__->index + 4) = it.curr.inst._4_4_;
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->inst = this;
    __return_storage_ptr__->index = 0;
    __return_storage_ptr__->type = find_type;
  }
  if ((this->field_0x30 & 2) == 0) {
    paVar3 = (anon_union_24_2_63b86169_for_instance_1 *)(this->field_1).simple_value_holder[0];
  }
  else {
    paVar3 = &this->field_1;
  }
  __return_storage_ptr__->vh = (void **)paVar3;
  return __return_storage_ptr__;
}

Assistant:

PYBIND11_NOINLINE value_and_holder instance::get_value_and_holder(const type_info *find_type /*= nullptr default in common.h*/, bool throw_if_missing /*= true in common.h*/) {
    // Optimize common case:
    if (!find_type || Py_TYPE(this) == find_type->type)
        return value_and_holder(this, find_type, 0, 0);

    detail::values_and_holders vhs(this);
    auto it = vhs.find(find_type);
    if (it != vhs.end())
        return *it;

    if (!throw_if_missing)
        return value_and_holder();

#if defined(NDEBUG)
    pybind11_fail("pybind11::detail::instance::get_value_and_holder: "
            "type is not a pybind11 base of the given instance "
            "(compile in debug mode for type details)");
#else
    pybind11_fail("pybind11::detail::instance::get_value_and_holder: `" +
            get_fully_qualified_tp_name(find_type->type) + "' is not a pybind11 base of the given `" +
            get_fully_qualified_tp_name(Py_TYPE(this)) + "' instance");
#endif
}